

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeCubeMap.cpp
# Opt level: O0

void makeCubeMap(EnvmapImage *image1,Header *header,RgbaChannels channels,char *outFileName,
                int tileWidth,int tileHeight,LevelMode levelMode,LevelRoundingMode roundingMode,
                Compression compression,int mapWidth,float filterRadius,int numSamples,bool verbose)

{
  char *pcVar1;
  char *in_RCX;
  bool in_stack_000000db;
  float in_stack_000000dc;
  int in_stack_000000e0;
  int in_stack_000000e4;
  char *in_stack_000000e8;
  RgbaChannels in_stack_000000f4;
  Header *in_stack_000000f8;
  EnvmapImage *in_stack_00000100;
  LevelMode in_stack_00000110;
  LevelRoundingMode in_stack_00000118;
  Compression in_stack_00000120;
  int in_stack_00000128;
  int in_stack_00000130;
  bool in_stack_0000017b;
  float in_stack_0000017c;
  int in_stack_00000180;
  int in_stack_00000184;
  char *in_stack_00000188;
  RgbaChannels in_stack_00000194;
  Header *in_stack_00000198;
  EnvmapImage *in_stack_000001a0;
  Compression in_stack_000001b0;
  int in_stack_000001b8;
  int in_stack_000001c0;
  
  pcVar1 = strchr(in_RCX,0x25);
  if (pcVar1 == (char *)0x0) {
    anon_unknown.dwarf_10831::makeCubeMapSingleFile
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,
               in_stack_000000e4,in_stack_000000e0,in_stack_00000110,in_stack_00000118,
               in_stack_00000120,in_stack_00000128,in_stack_000000dc,in_stack_00000130,
               in_stack_000000db);
  }
  else {
    anon_unknown.dwarf_10831::makeCubeMapSixFiles
              (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000188,
               in_stack_00000184,in_stack_00000180,in_stack_000001b0,in_stack_000001b8,
               in_stack_0000017c,in_stack_000001c0,in_stack_0000017b);
  }
  return;
}

Assistant:

void
makeCubeMap (
    EnvmapImage&      image1,
    Header&           header,
    RgbaChannels      channels,
    const char        outFileName[],
    int               tileWidth,
    int               tileHeight,
    LevelMode         levelMode,
    LevelRoundingMode roundingMode,
    Compression       compression,
    int               mapWidth,
    float             filterRadius,
    int               numSamples,
    bool              verbose)
{
    if (strchr (outFileName, '%'))
    {
        makeCubeMapSixFiles (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
    else
    {
        makeCubeMapSingleFile (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            levelMode,
            roundingMode,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
}